

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::
     vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  undefined1 uVar1;
  long lVar2;
  raw_node *pSrc;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  
  if (num != 0) {
    lVar5 = 0;
    do {
      if (*(char *)((long)pSrc_void + lVar5 + 0x44) == '\0') {
        uVar1 = 0;
      }
      else {
        puVar3 = (undefined4 *)((long)pSrc_void + lVar5);
        puVar4 = (undefined4 *)((long)pDst_void + lVar5);
        for (lVar2 = 0x11; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = *puVar3;
          puVar3 = puVar3 + 1;
          puVar4 = puVar4 + 1;
        }
        uVar1 = 1;
      }
      *(undefined1 *)((long)pDst_void + lVar5 + 0x44) = uVar1;
      lVar5 = lVar5 + 0x48;
    } while ((ulong)num * 0x48 != lVar5);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }